

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O3

UniValue * __thiscall
NetinfoRequestHandler::ProcessReply
          (UniValue *__return_storage_ptr__,NetinfoRequestHandler *this,UniValue *batch_in)

{
  size_t *fmt;
  size_t *args_1;
  unsigned_short *puVar1;
  byte bVar2;
  VType VVar3;
  long lVar4;
  pointer pcVar5;
  pointer pPVar6;
  UniValue result_00;
  UniValue error;
  optional<UniValue> id;
  char *pcVar7;
  pointer pcVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  UniValue *pUVar12;
  UniValue *pUVar13;
  long lVar14;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar15;
  long lVar16;
  string *psVar17;
  long lVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  UniValue *pUVar20;
  UniValue *pUVar21;
  runtime_error *this_00;
  ulong uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  char (*args) [2];
  char *pcVar24;
  size_t i;
  pointer pcVar25;
  pointer pPVar26;
  pointer pUVar27;
  vector<UniValue,_std::allocator<UniValue>_> *__range2;
  char *__end;
  char *__end_7;
  array<const_char_*,_7UL> *paVar28;
  long in_FS_OFFSET;
  bool bVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar30;
  char **args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  NetinfoRequestHandler *pNVar31;
  uint8_t *puVar32;
  uint8_t *args_00;
  uint8_t *args_01;
  pointer pUVar33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar34;
  int in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  undefined1 in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb09;
  undefined1 in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb11;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  pointer in_stack_fffffffffffffb28;
  double in_stack_fffffffffffffb30;
  vector<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
  *in_stack_fffffffffffffb38;
  long in_stack_fffffffffffffb40;
  long in_stack_fffffffffffffb48;
  long in_stack_fffffffffffffb50;
  long in_stack_fffffffffffffb58;
  array<std::array<unsigned_short,_8UL>,_3UL> *in_stack_fffffffffffffb60;
  size_t in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  long in_stack_fffffffffffffb78;
  pointer in_stack_fffffffffffffb80;
  long local_478;
  long local_470;
  undefined7 uStack_468;
  undefined1 local_461 [9];
  vector<UniValue,_std::allocator<UniValue>_> batch;
  _Optional_payload_base<UniValue> local_440;
  VType local_3e0;
  long *local_3d8 [2];
  long local_3c8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  vector<UniValue,_std::allocator<UniValue>_> local_3a0;
  UniValue local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  long *local_310 [2];
  long local_300 [2];
  string local_2f0;
  string local_2d0;
  string local_2b0;
  int peer_id;
  undefined4 uStack_28c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  int64_t addr_rate_limited;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  int64_t addr_processed;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string result;
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  double local_170;
  pointer local_168;
  int64_t local_160;
  int64_t local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  int local_130;
  int local_12c;
  int local_128;
  bool local_124;
  bool local_123;
  bool local_122;
  bool local_121;
  bool local_120;
  size_t max_addr_size;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  array<const_char_*,_3UL> rows;
  vector<signed_char,_std::allocator<signed_char>_> reachable_networks;
  string age;
  string addr;
  string conn_type;
  string network;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  JSONRPCProcessBatchReply(&batch,batch_in);
  pUVar27 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"error","");
  pUVar12 = UniValue::operator[](pUVar27,&result);
  VVar3 = pUVar12->typ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
  }
  pUVar27 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (VVar3 == VNULL) {
    result._M_dataplus._M_p = (pointer)&result.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"error","");
    pUVar12 = UniValue::operator[](pUVar27 + 1,&result);
    VVar3 = pUVar12->typ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
    }
    pUVar27 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (VVar3 == VNULL) {
      result._M_dataplus._M_p = (pointer)&result.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"result","");
      pUVar12 = UniValue::operator[](pUVar27 + 1,&result);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      result._M_dataplus._M_p = (pointer)&result.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"version","");
      pUVar13 = UniValue::operator[](pUVar12,&result);
      iVar11 = UniValue::getInt<int>(pUVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      if (iVar11 < 0x333ec) goto LAB_001319f5;
      lVar14 = std::chrono::_V2::system_clock::now();
      pUVar27 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start;
      result._M_dataplus._M_p = (pointer)&result.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"result","");
      pUVar13 = UniValue::operator[](pUVar27,&result);
      pvVar15 = UniValue::getValues(pUVar13);
      lVar16 = lVar14 / 1000000000 + (lVar14 >> 0x3f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      lVar16 = lVar16 - (lVar14 >> 0x3f);
      pUVar27 = (pvVar15->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar33 = (pvVar15->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pUVar27 != pUVar33) {
        in_stack_fffffffffffffb60 = &this->m_counts;
        in_stack_fffffffffffffb38 = &this->m_peers;
        do {
          result._M_dataplus._M_p = (pointer)&result.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&result,"network","");
          pUVar13 = UniValue::operator[](pUVar27,&result);
          psVar17 = UniValue::get_str_abi_cxx11_(pUVar13);
          pcVar5 = (psVar17->_M_dataplus)._M_p;
          network._M_dataplus._M_p = (pointer)&network.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&network,pcVar5,pcVar5 + psVar17->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != &result.field_2) {
            operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
          }
          lVar14 = 0;
          pcVar25 = (pointer)0x0;
          do {
            iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(&network,*(char **)((long)NETWORKS._M_elems + lVar14));
            if (iVar11 == 0) {
              if (pcVar25 != (pointer)0xff) {
                result._M_dataplus._M_p = (pointer)&result.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&result,"inbound","");
                pUVar13 = UniValue::operator[](pUVar27,&result);
                bVar29 = UniValue::get_bool(pUVar13);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)result._M_dataplus._M_p != &result.field_2) {
                  operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
                }
                result._M_dataplus._M_p = (pointer)&result.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&result,"relaytxes","");
                pUVar13 = UniValue::operator[](pUVar27,&result);
                if (pUVar13->typ == VNULL) {
                  in_stack_fffffffffffffb10 = true;
                }
                else {
                  conn_type._M_dataplus._M_p = (pointer)&conn_type.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&conn_type,"relaytxes","");
                  pUVar13 = UniValue::operator[](pUVar27,&conn_type);
                  in_stack_fffffffffffffb10 = UniValue::get_bool(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
                    operator_delete(conn_type._M_dataplus._M_p,
                                    conn_type.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)result._M_dataplus._M_p != &result.field_2) {
                  operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
                }
                result._M_dataplus._M_p = (pointer)&result.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&result,"connection_type","");
                pUVar13 = UniValue::operator[](pUVar27,&result);
                psVar17 = UniValue::get_str_abi_cxx11_(pUVar13);
                conn_type._M_dataplus._M_p = (pointer)&conn_type.field_2;
                pcVar5 = (psVar17->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&conn_type,pcVar5,pcVar5 + psVar17->_M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)result._M_dataplus._M_p != &result.field_2) {
                  operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
                }
                if ((pointer)0x7 < pcVar25) goto LAB_001319c8;
                in_stack_fffffffffffffb08 = !bVar29;
                puVar1 = (this->m_counts)._M_elems[(byte)in_stack_fffffffffffffb08]._M_elems +
                         (long)pcVar25;
                *puVar1 = *puVar1 + 1;
                puVar1 = in_stack_fffffffffffffb60->_M_elems[(byte)in_stack_fffffffffffffb08].
                         _M_elems + 7;
                *puVar1 = *puVar1 + 1;
                puVar1 = (this->m_counts)._M_elems[2]._M_elems + (long)pcVar25;
                *puVar1 = *puVar1 + 1;
                puVar1 = (this->m_counts)._M_elems[2]._M_elems + 7;
                *puVar1 = *puVar1 + 1;
                iVar11 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&conn_type,"block-relay-only");
                if (iVar11 == 0) {
                  this->m_block_relay_peers_count = this->m_block_relay_peers_count + '\x01';
                }
                iVar11 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&conn_type,"manual");
                if (iVar11 == 0) {
                  this->m_manual_peers_count = this->m_manual_peers_count + '\x01';
                }
                if ((byte)(this->m_details_level - 1) < 4) {
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"id","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  iVar11 = UniValue::getInt<int>(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  peer_id = iVar11;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"mapped_as","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  if (pUVar13->typ == VNULL) {
                    in_stack_fffffffffffffb00 = 0;
                  }
                  else {
                    addr._M_dataplus._M_p = (pointer)&addr.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"mapped_as","");
                    pUVar13 = UniValue::operator[](pUVar27,&addr);
                    in_stack_fffffffffffffb00 = UniValue::getInt<int>(pUVar13);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)addr._M_dataplus._M_p != &addr.field_2) {
                      operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"version","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  in_stack_fffffffffffffb1c = UniValue::getInt<int>(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&result,"addr_processed","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  if (pUVar13->typ == VNULL) {
                    lVar18 = 0;
                  }
                  else {
                    addr._M_dataplus._M_p = (pointer)&addr.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&addr,"addr_processed","");
                    pUVar13 = UniValue::operator[](pUVar27,&addr);
                    lVar18 = UniValue::getInt<long>(pUVar13);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)addr._M_dataplus._M_p != &addr.field_2) {
                      operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  addr_processed = lVar18;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&result,"addr_rate_limited","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  if (pUVar13->typ == VNULL) {
                    lVar18 = 0;
                  }
                  else {
                    addr._M_dataplus._M_p = (pointer)&addr.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&addr,"addr_rate_limited","");
                    pUVar13 = UniValue::operator[](pUVar27,&addr);
                    lVar18 = UniValue::getInt<long>(pUVar13);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)addr._M_dataplus._M_p != &addr.field_2) {
                      operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  addr_rate_limited = lVar18;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"conntime","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  lVar18 = UniValue::getInt<long>(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"last_block","")
                  ;
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  in_stack_fffffffffffffb58 = UniValue::getInt<long>(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"lastrecv","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  in_stack_fffffffffffffb50 = UniValue::getInt<long>(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"lastsend","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  in_stack_fffffffffffffb48 = UniValue::getInt<long>(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&result,"last_transaction","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  in_stack_fffffffffffffb40 = UniValue::getInt<long>(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"minping","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  in_stack_fffffffffffffb30 = -1.0;
                  if (pUVar13->typ != VNULL) {
                    addr._M_dataplus._M_p = (pointer)&addr.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"minping","");
                    pUVar13 = UniValue::operator[](pUVar27,&addr);
                    in_stack_fffffffffffffb30 = UniValue::get_real(pUVar13);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)addr._M_dataplus._M_p != &addr.field_2) {
                      operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"pingtime","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  in_stack_fffffffffffffb28 = (pointer)0xbff0000000000000;
                  if (pUVar13->typ != VNULL) {
                    addr._M_dataplus._M_p = (pointer)&addr.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"pingtime","");
                    pUVar13 = UniValue::operator[](pUVar27,&addr);
                    in_stack_fffffffffffffb28 = (pointer)UniValue::get_real(pUVar13);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)addr._M_dataplus._M_p != &addr.field_2) {
                      operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"addr","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  psVar17 = UniValue::get_str_abi_cxx11_(pUVar13);
                  addr._M_dataplus._M_p = (pointer)&addr.field_2;
                  pcVar5 = (psVar17->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&addr,pcVar5,pcVar5 + psVar17->_M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  if (lVar18 == 0) {
                    age._M_dataplus._M_p = (pointer)&age.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&age,"");
                  }
                  else {
                    result._M_dataplus._M_p = (pointer)((lVar16 - lVar18) / 0x3c);
                    util::ToString<long>(&age,(long *)&result);
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"subver","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  psVar17 = UniValue::get_str_abi_cxx11_(pUVar13);
                  reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)&reachable_networks.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pcVar5 = (psVar17->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&reachable_networks,pcVar5,pcVar5 + psVar17->_M_string_length
                            );
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&result,"transport_protocol_type","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  if (pUVar13->typ == VNULL) {
                    rows._M_elems[0] = (char *)(rows._M_elems + 2);
                    std::__cxx11::string::_M_construct<char_const*>((string *)&rows,"v1","");
                  }
                  else {
                    max_addr_size = (size_t)&local_108;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&max_addr_size,"transport_protocol_type","");
                    pUVar13 = UniValue::operator[](pUVar27,(string *)&max_addr_size);
                    psVar17 = UniValue::get_str_abi_cxx11_(pUVar13);
                    rows._M_elems[0] = (char *)(rows._M_elems + 2);
                    pcVar5 = (psVar17->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&rows,pcVar5,pcVar5 + psVar17->_M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)max_addr_size != &local_108) {
                      operator_delete((void *)max_addr_size,local_108._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&result,"addr_relay_enabled","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  if (pUVar13->typ == VNULL) {
                    bVar29 = false;
                  }
                  else {
                    max_addr_size = (size_t)&local_108;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&max_addr_size,"addr_relay_enabled","");
                    pUVar13 = UniValue::operator[](pUVar27,(string *)&max_addr_size);
                    bVar29 = UniValue::get_bool(pUVar13);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)max_addr_size != &local_108) {
                      operator_delete((void *)max_addr_size,local_108._M_allocated_capacity + 1);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&result,"bip152_hb_from","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  bVar9 = UniValue::get_bool(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&result,"bip152_hb_to","");
                  pUVar13 = UniValue::operator[](pUVar27,&result);
                  bVar10 = UniValue::get_bool(pUVar13);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&result,addr._M_dataplus._M_p,
                             addr._M_dataplus._M_p + addr._M_string_length);
                  local_210._M_p = (pointer)&local_200;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_210,
                             reachable_networks.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             reachable_networks.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                             (long)reachable_networks.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
                  local_1f0._M_p = (pointer)&local_1e0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1f0,conn_type._M_dataplus._M_p,
                             conn_type._M_dataplus._M_p + conn_type._M_string_length);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1d0,
                             *(char **)((long)NETWORK_SHORT_NAMES._M_elems + lVar14),
                             (allocator<char> *)&max_addr_size);
                  local_1b0._M_p = (pointer)&local_1a0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1b0,age._M_dataplus._M_p,
                             age._M_dataplus._M_p + age._M_string_length);
                  local_190._M_p = (pointer)&local_180;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_190,rows._M_elems[0],
                             rows._M_elems[1] + (long)rows._M_elems[0]);
                  local_160 = addr_processed;
                  local_158 = addr_rate_limited;
                  local_130 = peer_id;
                  local_170 = in_stack_fffffffffffffb30;
                  local_168 = in_stack_fffffffffffffb28;
                  local_150 = in_stack_fffffffffffffb58;
                  local_148 = in_stack_fffffffffffffb50;
                  local_140 = in_stack_fffffffffffffb48;
                  local_138 = in_stack_fffffffffffffb40;
                  local_12c = in_stack_fffffffffffffb00;
                  local_128 = in_stack_fffffffffffffb1c;
                  local_124 = bVar29;
                  local_123 = bVar9;
                  local_122 = bVar10;
                  local_121 = (bool)in_stack_fffffffffffffb08;
                  local_120 = (bool)in_stack_fffffffffffffb10;
                  std::
                  vector<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                  ::emplace_back<NetinfoRequestHandler::Peer>
                            (in_stack_fffffffffffffb38,(Peer *)&result);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_p != &local_180) {
                    operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_p != &local_1a0) {
                    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d0._M_p != &local_1c0) {
                    operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_p != &local_1e0) {
                    operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_p != &local_200) {
                    operator_delete(local_210._M_p,local_200._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  uVar22 = addr._M_string_length + 1;
                  if (addr._M_string_length + 1 <= this->m_max_addr_length) {
                    uVar22 = this->m_max_addr_length;
                  }
                  this->m_max_addr_length = uVar22;
                  pNVar31 = this;
                  util::ToString<long>(&result,&addr_processed);
                  uVar22 = this->m_max_addr_processed_length;
                  if (this->m_max_addr_processed_length < result._M_string_length) {
                    uVar22 = result._M_string_length;
                  }
                  this->m_max_addr_processed_length = uVar22;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  util::ToString<long>(&result,&addr_rate_limited);
                  uVar22 = pNVar31->m_max_addr_rate_limited_length;
                  if (pNVar31->m_max_addr_rate_limited_length < result._M_string_length) {
                    uVar22 = result._M_string_length;
                  }
                  pNVar31->m_max_addr_rate_limited_length = uVar22;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  uVar22 = pNVar31->m_max_age_length;
                  if (pNVar31->m_max_age_length < age._M_string_length) {
                    uVar22 = age._M_string_length;
                  }
                  pNVar31->m_max_age_length = uVar22;
                  this = pNVar31;
                  util::ToString<int>(&result,&peer_id);
                  uVar22 = pNVar31->m_max_id_length;
                  if (pNVar31->m_max_id_length < result._M_string_length) {
                    uVar22 = result._M_string_length;
                  }
                  pNVar31->m_max_id_length = uVar22;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                  this->m_is_asmap_on = (bool)(this->m_is_asmap_on | in_stack_fffffffffffffb00 != 0)
                  ;
                  if ((char **)rows._M_elems[0] != rows._M_elems + 2) {
                    operator_delete(rows._M_elems[0],(ulong)(rows._M_elems[2] + 1));
                  }
                  if ((pointer *)
                      reachable_networks.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start !=
                      &reachable_networks.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(reachable_networks.
                                    super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (ulong)(reachable_networks.
                                            super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1))
                    ;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)age._M_dataplus._M_p != &age.field_2) {
                    operator_delete(age._M_dataplus._M_p,age.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)addr._M_dataplus._M_p != &addr.field_2) {
                    operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
                  operator_delete(conn_type._M_dataplus._M_p,
                                  conn_type.field_2._M_allocated_capacity + 1);
                }
              }
              break;
            }
            pcVar25 = pcVar25 + 1;
            lVar14 = lVar14 + 8;
          } while (pcVar25 != (pointer)0x7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          pUVar27 = pUVar27 + 1;
        } while (pUVar27 != pUVar33);
      }
      FormatFullVersion_abi_cxx11_();
      pNVar31 = this;
      ChainToString_abi_cxx11_(&conn_type,this);
      addr._M_dataplus._M_p = (pointer)&addr.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"protocolversion","");
      pUVar13 = UniValue::operator[](pUVar12,&addr);
      iVar11 = UniValue::getInt<int>(pUVar13);
      reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(reachable_networks.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,iVar11);
      age._M_dataplus._M_p = (pointer)&age.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&age,"subversion","");
      pUVar13 = UniValue::operator[](pUVar12,&age);
      pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x130387;
      psVar17 = UniValue::get_str_abi_cxx11_(pUVar13);
      pcVar24 = (char *)&network;
      tinyformat::
      format<char[13],std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
                (&result,(tinyformat *)"%s client %s%s - server %i%s\n\n","Bitcoin Core",
                 (char (*) [13])pcVar24,&conn_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &reachable_networks,(int *)psVar17,pbVar30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)age._M_dataplus._M_p != &age.field_2) {
        operator_delete(age._M_dataplus._M_p,age.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)addr._M_dataplus._M_p != &addr.field_2) {
        operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
        operator_delete(conn_type._M_dataplus._M_p,conn_type.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)network._M_dataplus._M_p != &network.field_2) {
        operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
      }
      pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00);
      if ((byte)(this->m_details_level - 1) < 4) {
        pPVar26 = (this->m_peers).
                  super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar6 = (this->m_peers).
                 super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00);
        if (pPVar26 != pPVar6) {
          uVar22 = ((long)pPVar6 - (long)pPVar26 >> 3) * -0x5075075075075075;
          lVar14 = 0x3f;
          if (uVar22 != 0) {
            for (; uVar22 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<NetinfoRequestHandler::Peer*,std::vector<NetinfoRequestHandler::Peer,std::allocator<NetinfoRequestHandler::Peer>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pPVar26,pPVar6,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<NetinfoRequestHandler::Peer*,std::vector<NetinfoRequestHandler::Peer,std::allocator<NetinfoRequestHandler::Peer>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pPVar26,pPVar6);
          fmt = &this->m_max_addr_processed_length;
          args_1 = &this->m_max_addr_rate_limited_length;
          pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &this->m_max_age_length;
          in_stack_fffffffffffffb10 = SUB81(fmt,0);
          in_stack_fffffffffffffb11 = (undefined7)((ulong)fmt >> 8);
          in_stack_fffffffffffffb08 = SUB81(args_1,0);
          in_stack_fffffffffffffb09 = (undefined7)((ulong)args_1 >> 8);
          tinyformat::format<unsigned_long,char[6],unsigned_long,char[6],unsigned_long,char[4]>
                    (&network,(tinyformat *)
                              "<->   type   net  v  mping   ping send recv  txn  blk  hb %*s%*s%*s "
                     ,(char *)fmt,(unsigned_long *)"addrp",(char (*) [6])args_1,
                     (unsigned_long *)"addrl",(char (*) [6])pbVar34,(unsigned_long *)0x1adcd1,
                     (char (*) [4])in_stack_fffffffffffffad8);
          args_4 = (char **)0x130510;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            args_4 = (char **)0x130535;
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          if (this->m_is_asmap_on == true) {
            args_4 = (char **)0x13054f;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result," asmap ");
          }
          pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &this->m_max_id_length;
          bVar29 = (this->m_details_level - 2 & 0xfd) == 0;
          conn_type._M_dataplus._M_p = (pointer)0x0;
          if (bVar29) {
            conn_type._M_dataplus._M_p = (pointer)this->m_max_addr_length;
          }
          psVar17 = &conn_type;
          addr._M_dataplus._M_p = "address";
          if (!bVar29) {
            addr._M_dataplus._M_p = "";
          }
          age._M_dataplus._M_p = "version";
          if (1 < (byte)(this->m_details_level - 3)) {
            age._M_dataplus._M_p = "";
          }
          tinyformat::format<unsigned_long,char[3],unsigned_long,char_const*,char_const*>
                    (&network,(tinyformat *)0x1acb83,(char *)pbVar30,(unsigned_long *)0x1ad9cd,
                     (char (*) [3])psVar17,(unsigned_long *)&addr,(char **)&age,args_4);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          pPVar26 = (this->m_peers).
                    super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar6 = (this->m_peers).
                   super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pPVar26 != pPVar6) {
            do {
              util::ToString<int>(&conn_type,&pPVar26->version);
              pbVar19 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&conn_type,(pPVar26->sub_version)._M_dataplus._M_p,
                                   (pPVar26->sub_version)._M_string_length);
              network._M_dataplus._M_p = (pointer)&network.field_2;
              pcVar5 = (pbVar19->_M_dataplus)._M_p;
              paVar23 = &pbVar19->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar5 == paVar23) {
                network.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
                network.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
              }
              else {
                network.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
                network._M_dataplus._M_p = pcVar5;
              }
              network._M_string_length = pbVar19->_M_string_length;
              (pbVar19->_M_dataplus)._M_p = (pointer)paVar23;
              pbVar19->_M_string_length = 0;
              (pbVar19->field_2)._M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
                operator_delete(conn_type._M_dataplus._M_p,
                                conn_type.field_2._M_allocated_capacity + 1);
              }
              local_461._1_8_ = "connections_in";
              if (pPVar26->is_outbound != false) {
                local_461._1_8_ = "connections_out";
              }
              local_461._1_8_ = local_461._1_8_ + 0xc;
              ConnectionTypeForNetinfo(&addr,this,&pPVar26->conn_type);
              local_461[0] = ' ';
              if (((pPVar26->transport_protocol_type)._M_string_length == 2) &&
                 (pcVar24 = (pPVar26->transport_protocol_type)._M_dataplus._M_p, *pcVar24 == 'v')) {
                local_461[0] = pcVar24[1];
              }
              PingTimeToString_abi_cxx11_(&age,this,pPVar26->min_ping);
              PingTimeToString_abi_cxx11_((string *)&reachable_networks,this,pPVar26->ping);
              if (pPVar26->last_send == 0) {
                rows._M_elems[0] = (char *)(rows._M_elems + 2);
                std::__cxx11::string::_M_construct<char_const*>((string *)&rows,"","");
              }
              else {
                local_470 = lVar16 - pPVar26->last_send;
                util::ToString<long>((string *)&rows,&local_470);
              }
              if (pPVar26->last_recv == 0) {
                max_addr_size = (size_t)&local_108;
                std::__cxx11::string::_M_construct<char_const*>((string *)&max_addr_size,"","");
              }
              else {
                local_478 = lVar16 - pPVar26->last_recv;
                util::ToString<long>((string *)&max_addr_size,&local_478);
              }
              if (pPVar26->last_trxn == 0) {
                pcVar24 = "*";
                if ((ulong)pPVar26->is_tx_relay != 0) {
                  pcVar24 = "";
                }
                addr_processed = (int64_t)&local_240;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&addr_processed,pcVar24,
                           pcVar24 + ((ulong)pPVar26->is_tx_relay ^ 1));
              }
              else {
                in_stack_fffffffffffffb80 = (pointer)((lVar16 - pPVar26->last_trxn) / 0x3c);
                util::ToString<long>((string *)&addr_processed,(long *)&stack0xfffffffffffffb80);
              }
              if (pPVar26->last_blck == 0) {
                addr_rate_limited = (int64_t)&local_260;
                std::__cxx11::string::_M_construct<char_const*>((string *)&addr_rate_limited,"","");
              }
              else {
                in_stack_fffffffffffffb78 = (lVar16 - pPVar26->last_blck) / 0x3c;
                util::ToString<long>((string *)&addr_rate_limited,(long *)&stack0xfffffffffffffb78);
              }
              args = (char (*) [2])0x1acbe7;
              pcVar24 = " ";
              if (pPVar26->is_bip152_hb_to != false) {
                pcVar24 = ".";
              }
              if (pPVar26->is_bip152_hb_from != false) {
                args = (char (*) [2])0x1aefa7;
              }
              tinyformat::format<char[2],char[2]>
                        ((string *)&peer_id,(tinyformat *)"%s%s",pcVar24,args,(char (*) [2])psVar17)
              ;
              if (pPVar26->addr_processed == 0) {
                pcVar24 = ".";
                if ((ulong)pPVar26->is_addr_relay_enabled != 0) {
                  pcVar24 = "";
                }
                local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2b0,pcVar24,
                           pcVar24 + ((ulong)pPVar26->is_addr_relay_enabled ^ 1));
              }
              else {
                util::ToString<long>(&local_2b0,&pPVar26->addr_processed);
              }
              if (pPVar26->addr_rate_limited == 0) {
                local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"","");
              }
              else {
                util::ToString<long>(&local_2d0,&pPVar26->addr_rate_limited);
              }
              in_stack_fffffffffffffb74 = 0;
              if (this->m_is_asmap_on != false) {
                in_stack_fffffffffffffb74 = 7;
              }
              if ((this->m_is_asmap_on == true) && (pPVar26->mapped_as != 0)) {
                util::ToString<int>(&local_2f0,&pPVar26->mapped_as);
              }
              else {
                local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"","");
              }
              bVar2 = this->m_details_level;
              if ((bVar2 - 2 & 0xfffffffd) == 0) {
                in_stack_fffffffffffffb68 = this->m_max_addr_length;
              }
              else {
                in_stack_fffffffffffffb68 = 0;
              }
              if ((bVar2 == 4) || (bVar2 == 2)) {
                local_310[0] = local_300;
                pcVar5 = (pPVar26->addr)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_310,pcVar5,pcVar5 + (pPVar26->addr)._M_string_length);
              }
              else {
                local_310[0] = local_300;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"","");
              }
              if (((byte)(this->m_details_level - 3) < 2) &&
                 (iVar11 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(&network,"0"), iVar11 != 0)) {
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_330,network._M_dataplus._M_p,
                           network._M_dataplus._M_p + network._M_string_length);
              }
              else {
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"","");
              }
              psVar17 = &pPVar26->network;
              tinyformat::
              format<char_const*,std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,std::__cxx11::string,int,std::__cxx11::string,unsigned_long,int,unsigned_long,std::__cxx11::string,std::__cxx11::string>
                        (&conn_type,
                         (tinyformat *)
                         "%3s %6s %5s %2s%7s%7s%5s%5s%5s%5s  %2s %*s%*s%*s%*i %*s %-*s%s\n",
                         local_461 + 1,(char **)&addr,psVar17,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_461,(char *)&age,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &reachable_networks,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rows,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &max_addr_size,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &addr_processed,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &addr_rate_limited,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &peer_id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT71(in_stack_fffffffffffffb11,in_stack_fffffffffffffb10),
                         (unsigned_long *)&local_2b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(in_stack_fffffffffffffb09,in_stack_fffffffffffffb08),
                         (unsigned_long *)&local_2d0,pbVar34,(unsigned_long *)&pPVar26->age,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffb74,(int *)&local_2f0,pbVar30,
                         (unsigned_long *)&pPVar26->id,(int *)&stack0xfffffffffffffb68,
                         (unsigned_long *)local_310,&local_330,in_stack_fffffffffffffad8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&result,conn_type._M_dataplus._M_p,conn_type._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
                operator_delete(conn_type._M_dataplus._M_p,
                                conn_type.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              if (local_310[0] != local_300) {
                operator_delete(local_310[0],local_300[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(uStack_28c,peer_id) != &local_280) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(uStack_28c,peer_id),local_280._M_allocated_capacity + 1)
                ;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)addr_rate_limited != &local_260) {
                operator_delete((void *)addr_rate_limited,local_260._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)addr_processed != &local_240) {
                operator_delete((void *)addr_processed,local_240._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)max_addr_size != &local_108) {
                operator_delete((void *)max_addr_size,local_108._M_allocated_capacity + 1);
              }
              if ((char **)rows._M_elems[0] != rows._M_elems + 2) {
                operator_delete(rows._M_elems[0],(ulong)(rows._M_elems[2] + 1));
              }
              if ((pointer *)
                  reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  &reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(reachable_networks.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (ulong)(reachable_networks.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)age._M_dataplus._M_p != &age.field_2) {
                operator_delete(age._M_dataplus._M_p,age.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)addr._M_dataplus._M_p != &addr.field_2) {
                operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)network._M_dataplus._M_p != &network.field_2) {
                operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
              }
              pPVar26 = pPVar26 + 1;
            } while (pPVar26 != pPVar6);
          }
          pcVar24 = "min";
          tinyformat::format<unsigned_long,char[4]>
                    (&network,(tinyformat *)
                              "                        ms     ms  sec  sec  min  min                %*s\n\n"
                     ,(char *)pbVar34,(unsigned_long *)"min",(char (*) [4])psVar17);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,"     ");
      reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      network._M_dataplus._M_p = (pointer)&network.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&network,"networks","");
      pUVar13 = UniValue::operator[](pUVar12,&network);
      pvVar15 = UniValue::getValues(pUVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)network._M_dataplus._M_p != &network.field_2) {
        operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
      }
      pUVar21 = (pvVar15->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (pUVar13 = (pvVar15->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_start; pUVar13 != pUVar21; pUVar13 = pUVar13 + 1) {
        network._M_dataplus._M_p = (pointer)&network.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&network,"reachable","");
        pUVar20 = UniValue::operator[](pUVar13,&network);
        bVar29 = UniValue::get_bool(pUVar20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)network._M_dataplus._M_p != &network.field_2) {
          operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
        }
        if (bVar29) {
          network._M_dataplus._M_p = (pointer)&network.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&network,"name","");
          pUVar20 = UniValue::operator[](pUVar13,&network);
          psVar17 = UniValue::get_str_abi_cxx11_(pUVar20);
          this = pNVar31;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
            this = pNVar31;
          }
          paVar28 = &NETWORKS;
          lVar16 = 0;
          do {
            iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::compare(psVar17,paVar28->_M_elems[0]);
            pNVar31 = this;
            if (iVar11 == 0) {
              conn_type._M_dataplus._M_p._0_1_ = -(char)lVar16;
              if (lVar16 != -0xff) {
                tinyformat::format<std::__cxx11::string>
                          (&network,(tinyformat *)"%8s",(char *)psVar17,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pcVar24);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&result,network._M_dataplus._M_p,network._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)network._M_dataplus._M_p != &network.field_2) {
                  operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1
                                 );
                }
                pNVar31 = this;
                if (reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<signed_char,std::allocator<signed_char>>::
                  _M_realloc_insert<signed_char_const&>
                            ((vector<signed_char,std::allocator<signed_char>> *)&reachable_networks,
                             (iterator)
                             reachable_networks.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_finish,(char *)&conn_type);
                }
                else {
                  *reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (char)conn_type._M_dataplus._M_p;
                  reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       reachable_networks.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              break;
            }
            lVar16 = lVar16 + -1;
            paVar28 = (array<const_char_*,_7UL> *)((long)paVar28 + 8);
          } while (lVar16 != -7);
        }
      }
      lVar16 = 0;
      do {
        iVar11 = *(int *)((long)UNREACHABLE_NETWORK_IDS._M_elems + lVar16);
        pcVar25 = (pointer)(long)iVar11;
        if ((pointer)0x7 < pcVar25) goto LAB_0013196e;
        if ((this->m_counts)._M_elems[2]._M_elems[(long)pcVar25] != 0) {
          if (iVar11 == 7) goto LAB_0013199b;
          tinyformat::format<char_const*>
                    (&network,(tinyformat *)"%8s",
                     (char *)(NETWORK_SHORT_NAMES._M_elems + (long)pcVar25),(char **)pcVar24);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          network._M_dataplus._M_p._0_1_ = (char)iVar11;
          std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                    (&reachable_networks,(char *)&network);
        }
        lVar16 = lVar16 + 4;
      } while (lVar16 != 8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,"   total   block");
      if (this->m_manual_peers_count != '\0') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,"  manual");
      }
      args_01 = &this->m_manual_peers_count;
      rows._M_elems[2] = "total";
      rows._M_elems[0] = "in";
      rows._M_elems[1] = "out";
      pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->m_counts
      ;
      puVar32 = &this->m_block_relay_peers_count;
      lVar16 = 0;
      do {
        tinyformat::format<char_const*>
                  (&network,(tinyformat *)"\n%-5s",(char *)(rows._M_elems + lVar16),(char **)pcVar24
                  );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&result,network._M_dataplus._M_p,network._M_string_length);
        args_00 = puVar32;
        pcVar24 = (char *)pbVar34;
        pcVar7 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar8 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)network._M_dataplus._M_p != &network.field_2) {
          operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          args_00 = puVar32;
          pcVar24 = (char *)pbVar34;
          pcVar7 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar8 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pcVar25 = reachable_networks.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_finish,
            pcVar7 != reachable_networks.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_finish; pcVar7 = pcVar7 + 1) {
          uVar22 = (ulong)*pcVar7;
          if (7 < uVar22) {
            reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
            .super__Vector_impl_data._M_finish = pcVar8;
            if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_001327d5;
            std::__throw_out_of_range_fmt
                      ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar22,8);
            goto LAB_0013196e;
          }
          reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar8;
          tinyformat::format<unsigned_short>
                    (&network,"%8i",
                     (unsigned_short *)
                     ((long)&((_Alloc_hider *)((long)pbVar34 + lVar16 * 0x10U))->_M_p + uVar22 * 2))
          ;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          pcVar8 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar25;
        }
        pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar24;
        reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar8;
        tinyformat::format<unsigned_short>
                  (&network,"   %5i",
                   (unsigned_short *)
                   ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pcVar24)->_M_string_length + lVar16 * 0x10 + 6));
        puVar32 = args_00;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&result,network._M_dataplus._M_p,network._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)network._M_dataplus._M_p != &network.field_2) {
          operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
        }
        if (lVar16 == 1) {
          tinyformat::format<unsigned_char>(&network,"   %5i",args_00);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&result,network._M_dataplus._M_p,network._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          if (*args_01 != '\0') {
            tinyformat::format<unsigned_char>(&network,"   %5i",args_01);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&result,network._M_dataplus._M_p,network._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)network._M_dataplus._M_p != &network.field_2) {
              operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
            }
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,"\n\nLocal addresses");
      network._M_dataplus._M_p = (pointer)&network.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&network,"localaddresses","");
      pUVar13 = __return_storage_ptr__;
      pUVar21 = UniValue::operator[](pUVar12,&network);
      pvVar15 = UniValue::getValues(pUVar21);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)network._M_dataplus._M_p != &network.field_2) {
        operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
      }
      pUVar27 = (pvVar15->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pUVar33 = (pvVar15->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pUVar27 == pUVar33) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,": n/a\n");
      }
      else {
        max_addr_size = 0;
        __return_storage_ptr__ = pUVar13;
        do {
          network._M_dataplus._M_p = (pointer)&network.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&network,"address","");
          pUVar13 = UniValue::operator[](pUVar27,&network);
          psVar17 = UniValue::get_str_abi_cxx11_(pUVar13);
          uVar22 = psVar17->_M_string_length + 1;
          if (uVar22 <= max_addr_size) {
            uVar22 = max_addr_size;
          }
          max_addr_size = uVar22;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)network._M_dataplus._M_p != &network.field_2) {
            operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
          }
          pUVar27 = pUVar27 + 1;
        } while (pUVar27 != pUVar33);
        pUVar27 = (pvVar15->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pUVar33 = (pvVar15->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pUVar13 = __return_storage_ptr__;
        if (pUVar27 != pUVar33) {
          do {
            conn_type._M_dataplus._M_p = (pointer)&conn_type.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&conn_type,"address","");
            pUVar13 = UniValue::operator[](pUVar27,&conn_type);
            psVar17 = UniValue::get_str_abi_cxx11_(pUVar13);
            addr._M_dataplus._M_p = (pointer)&addr.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"port","");
            pUVar13 = UniValue::operator[](pUVar27,&addr);
            iVar11 = UniValue::getInt<int>(pUVar13);
            addr_processed = CONCAT44(addr_processed._4_4_,iVar11);
            age._M_dataplus._M_p = (pointer)&age.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&age,"score","");
            pUVar13 = UniValue::operator[](pUVar27,&age);
            iVar11 = UniValue::getInt<int>(pUVar13);
            addr_rate_limited = CONCAT44(addr_rate_limited._4_4_,iVar11);
            tinyformat::format<unsigned_long,std::__cxx11::string,int,int>
                      (&network,(tinyformat *)"\n%-*s    port %6i    score %6i",
                       (char *)&max_addr_size,(unsigned_long *)psVar17,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &addr_processed,(int *)&addr_rate_limited,(int *)in_stack_fffffffffffffad8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&result,network._M_dataplus._M_p,network._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)network._M_dataplus._M_p != &network.field_2) {
              operator_delete(network._M_dataplus._M_p,network.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)age._M_dataplus._M_p != &age.field_2) {
              operator_delete(age._M_dataplus._M_p,age.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)addr._M_dataplus._M_p != &addr.field_2) {
              operator_delete(addr._M_dataplus._M_p,addr.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)conn_type._M_dataplus._M_p != &conn_type.field_2) {
              operator_delete(conn_type._M_dataplus._M_p,conn_type.field_2._M_allocated_capacity + 1
                             );
            }
            pUVar27 = pUVar27 + 1;
            pUVar13 = __return_storage_ptr__;
          } while (pUVar27 != pUVar33);
        }
      }
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_388,&result);
      local_3e0 = NullUniValue.typ;
      local_3d8[0] = local_3c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3d8,NullUniValue.val._M_dataplus._M_p,
                 NullUniValue.val._M_dataplus._M_p + NullUniValue.val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3b8,&NullUniValue.keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_3a0,&NullUniValue.values);
      network._M_dataplus._M_p._0_4_ = 1;
      UniValue::UniValue<int,_int,_true>((UniValue *)&local_440,(int *)&network);
      local_440._M_engaged = true;
      result_00.val._M_dataplus._M_p = (pointer)puVar32;
      result_00._0_8_ = in_stack_fffffffffffffad8;
      result_00.val._M_string_length = (size_type)args_01;
      result_00.val.field_2._M_allocated_capacity = (size_type)pbVar34;
      result_00.val.field_2._8_8_ = pUVar12;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)pbVar30;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)pbVar30 >> 0x20);
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = in_stack_fffffffffffffb08;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = in_stack_fffffffffffffb09;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_fffffffffffffb10;
      result_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_fffffffffffffb11;
      result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffb18;
      result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffb1c;
      result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = pUVar13;
      result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffb28;
      error.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb38;
      error._0_8_ = in_stack_fffffffffffffb30;
      error.val._M_string_length = in_stack_fffffffffffffb40;
      error.val.field_2._M_allocated_capacity = in_stack_fffffffffffffb48;
      error.val.field_2._8_8_ = in_stack_fffffffffffffb50;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb58;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb60;
      error.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb68;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffb70;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffb74;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb78;
      error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffb80;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.val._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_470;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._0_8_ = local_478;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.val._M_string_length._0_7_ = uStack_468;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._M_value.val._M_string_length._7_1_ = local_461[0];
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._24_8_ = local_461._1_8_;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._32_8_ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _40_56_ = stack0xfffffffffffffbb0;
      JSONRPCReplyObj(__return_storage_ptr__,result_00,error,id,(JSONRPCVersion)&local_388);
      if (local_440._M_engaged == true) {
        std::_Optional_payload_base<UniValue>::_M_destroy(&local_440);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3b8);
      if (local_3d8[0] != local_3c8) {
        operator_delete(local_3d8[0],local_3c8[0] + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_388.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.val._M_dataplus._M_p != &local_388.val.field_2) {
        operator_delete(local_388.val._M_dataplus._M_p,
                        local_388.val.field_2._M_allocated_capacity + 1);
      }
      if (reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(reachable_networks.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)reachable_networks.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)reachable_networks.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      __return_storage_ptr__->typ =
           batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start[1].typ;
      (__return_storage_ptr__->val)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->val).field_2;
      pcVar5 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start[1].val._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->val,pcVar5,
                 pcVar5 + batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                          super__Vector_impl_data._M_start[1].val._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->keys,
               &batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start[1].keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector
                (&__return_storage_ptr__->values,
                 &batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start[1].values);
    }
  }
  else {
    __return_storage_ptr__->typ =
         (batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start)->typ;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    pcVar5 = ((batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start)->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->val,pcVar5,
               pcVar5 + ((batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                          super__Vector_impl_data._M_start)->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->keys,
             &(batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start)->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              (&__return_storage_ptr__->values,
               &(batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start)->values);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&batch);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return __return_storage_ptr__;
  }
LAB_001327d5:
  __stack_chk_fail();
LAB_0013196e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_001327d5;
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",pcVar25,8);
LAB_0013199b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_001327d5;
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",pcVar25,7);
LAB_001319c8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_001327d5;
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",pcVar25,8);
LAB_001319f5:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"-netinfo requires bitcoind server to be running v0.21.0 and up");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  goto LAB_001327d5;
}

Assistant:

UniValue ProcessReply(const UniValue& batch_in) override
    {
        const std::vector<UniValue> batch{JSONRPCProcessBatchReply(batch_in)};
        if (!batch[ID_PEERINFO]["error"].isNull()) return batch[ID_PEERINFO];
        if (!batch[ID_NETWORKINFO]["error"].isNull()) return batch[ID_NETWORKINFO];

        const UniValue& networkinfo{batch[ID_NETWORKINFO]["result"]};
        if (networkinfo["version"].getInt<int>() < 209900) {
            throw std::runtime_error("-netinfo requires bitcoind server to be running v0.21.0 and up");
        }
        const int64_t time_now{TicksSinceEpoch<std::chrono::seconds>(CliClock::now())};

        // Count peer connection totals, and if DetailsRequested(), store peer data in a vector of structs.
        for (const UniValue& peer : batch[ID_PEERINFO]["result"].getValues()) {
            const std::string network{peer["network"].get_str()};
            const int8_t network_id{NetworkStringToId(network)};
            if (network_id == UNKNOWN_NETWORK) continue;
            const bool is_outbound{!peer["inbound"].get_bool()};
            const bool is_tx_relay{peer["relaytxes"].isNull() ? true : peer["relaytxes"].get_bool()};
            const std::string conn_type{peer["connection_type"].get_str()};
            ++m_counts.at(is_outbound).at(network_id);      // in/out by network
            ++m_counts.at(is_outbound).at(NETWORKS.size()); // in/out overall
            ++m_counts.at(2).at(network_id);                // total by network
            ++m_counts.at(2).at(NETWORKS.size());           // total overall
            if (conn_type == "block-relay-only") ++m_block_relay_peers_count;
            if (conn_type == "manual") ++m_manual_peers_count;
            if (DetailsRequested()) {
                // Push data for this peer to the peers vector.
                const int peer_id{peer["id"].getInt<int>()};
                const int mapped_as{peer["mapped_as"].isNull() ? 0 : peer["mapped_as"].getInt<int>()};
                const int version{peer["version"].getInt<int>()};
                const int64_t addr_processed{peer["addr_processed"].isNull() ? 0 : peer["addr_processed"].getInt<int64_t>()};
                const int64_t addr_rate_limited{peer["addr_rate_limited"].isNull() ? 0 : peer["addr_rate_limited"].getInt<int64_t>()};
                const int64_t conn_time{peer["conntime"].getInt<int64_t>()};
                const int64_t last_blck{peer["last_block"].getInt<int64_t>()};
                const int64_t last_recv{peer["lastrecv"].getInt<int64_t>()};
                const int64_t last_send{peer["lastsend"].getInt<int64_t>()};
                const int64_t last_trxn{peer["last_transaction"].getInt<int64_t>()};
                const double min_ping{peer["minping"].isNull() ? -1 : peer["minping"].get_real()};
                const double ping{peer["pingtime"].isNull() ? -1 : peer["pingtime"].get_real()};
                const std::string addr{peer["addr"].get_str()};
                const std::string age{conn_time == 0 ? "" : ToString((time_now - conn_time) / 60)};
                const std::string sub_version{peer["subver"].get_str()};
                const std::string transport{peer["transport_protocol_type"].isNull() ? "v1" : peer["transport_protocol_type"].get_str()};
                const bool is_addr_relay_enabled{peer["addr_relay_enabled"].isNull() ? false : peer["addr_relay_enabled"].get_bool()};
                const bool is_bip152_hb_from{peer["bip152_hb_from"].get_bool()};
                const bool is_bip152_hb_to{peer["bip152_hb_to"].get_bool()};
                m_peers.push_back({addr, sub_version, conn_type, NETWORK_SHORT_NAMES[network_id], age, transport, min_ping, ping, addr_processed, addr_rate_limited, last_blck, last_recv, last_send, last_trxn, peer_id, mapped_as, version, is_addr_relay_enabled, is_bip152_hb_from, is_bip152_hb_to, is_outbound, is_tx_relay});
                m_max_addr_length = std::max(addr.length() + 1, m_max_addr_length);
                m_max_addr_processed_length = std::max(ToString(addr_processed).length(), m_max_addr_processed_length);
                m_max_addr_rate_limited_length = std::max(ToString(addr_rate_limited).length(), m_max_addr_rate_limited_length);
                m_max_age_length = std::max(age.length(), m_max_age_length);
                m_max_id_length = std::max(ToString(peer_id).length(), m_max_id_length);
                m_is_asmap_on |= (mapped_as != 0);
            }
        }

        // Generate report header.
        std::string result{strprintf("%s client %s%s - server %i%s\n\n", PACKAGE_NAME, FormatFullVersion(), ChainToString(), networkinfo["protocolversion"].getInt<int>(), networkinfo["subversion"].get_str())};

        // Report detailed peer connections list sorted by direction and minimum ping time.
        if (DetailsRequested() && !m_peers.empty()) {
            std::sort(m_peers.begin(), m_peers.end());
            result += strprintf("<->   type   net  v  mping   ping send recv  txn  blk  hb %*s%*s%*s ",
                                m_max_addr_processed_length, "addrp",
                                m_max_addr_rate_limited_length, "addrl",
                                m_max_age_length, "age");
            if (m_is_asmap_on) result += " asmap ";
            result += strprintf("%*s %-*s%s\n", m_max_id_length, "id", IsAddressSelected() ? m_max_addr_length : 0, IsAddressSelected() ? "address" : "", IsVersionSelected() ? "version" : "");
            for (const Peer& peer : m_peers) {
                std::string version{ToString(peer.version) + peer.sub_version};
                result += strprintf(
                    "%3s %6s %5s %2s%7s%7s%5s%5s%5s%5s  %2s %*s%*s%*s%*i %*s %-*s%s\n",
                    peer.is_outbound ? "out" : "in",
                    ConnectionTypeForNetinfo(peer.conn_type),
                    peer.network,
                    (peer.transport_protocol_type.size() == 2 && peer.transport_protocol_type[0] == 'v') ? peer.transport_protocol_type[1] : ' ',
                    PingTimeToString(peer.min_ping),
                    PingTimeToString(peer.ping),
                    peer.last_send ? ToString(time_now - peer.last_send) : "",
                    peer.last_recv ? ToString(time_now - peer.last_recv) : "",
                    peer.last_trxn ? ToString((time_now - peer.last_trxn) / 60) : peer.is_tx_relay ? "" : "*",
                    peer.last_blck ? ToString((time_now - peer.last_blck) / 60) : "",
                    strprintf("%s%s", peer.is_bip152_hb_to ? "." : " ", peer.is_bip152_hb_from ? "*" : " "),
                    m_max_addr_processed_length, // variable spacing
                    peer.addr_processed ? ToString(peer.addr_processed) : peer.is_addr_relay_enabled ? "" : ".",
                    m_max_addr_rate_limited_length, // variable spacing
                    peer.addr_rate_limited ? ToString(peer.addr_rate_limited) : "",
                    m_max_age_length, // variable spacing
                    peer.age,
                    m_is_asmap_on ? 7 : 0, // variable spacing
                    m_is_asmap_on && peer.mapped_as ? ToString(peer.mapped_as) : "",
                    m_max_id_length, // variable spacing
                    peer.id,
                    IsAddressSelected() ? m_max_addr_length : 0, // variable spacing
                    IsAddressSelected() ? peer.addr : "",
                    IsVersionSelected() && version != "0" ? version : "");
            }
            result += strprintf("                        ms     ms  sec  sec  min  min                %*s\n\n", m_max_age_length, "min");
        }

        // Report peer connection totals by type.
        result += "     ";
        std::vector<int8_t> reachable_networks;
        for (const UniValue& network : networkinfo["networks"].getValues()) {
            if (network["reachable"].get_bool()) {
                const std::string& network_name{network["name"].get_str()};
                const int8_t network_id{NetworkStringToId(network_name)};
                if (network_id == UNKNOWN_NETWORK) continue;
                result += strprintf("%8s", network_name); // column header
                reachable_networks.push_back(network_id);
            }
        };

        for (const size_t network_id : UNREACHABLE_NETWORK_IDS) {
            if (m_counts.at(2).at(network_id) == 0) continue;
            result += strprintf("%8s", NETWORK_SHORT_NAMES.at(network_id)); // column header
            reachable_networks.push_back(network_id);
        }

        result += "   total   block";
        if (m_manual_peers_count) result += "  manual";

        const std::array rows{"in", "out", "total"};
        for (size_t i = 0; i < rows.size(); ++i) {
            result += strprintf("\n%-5s", rows[i]); // row header
            for (int8_t n : reachable_networks) {
                result += strprintf("%8i", m_counts.at(i).at(n)); // network peers count
            }
            result += strprintf("   %5i", m_counts.at(i).at(NETWORKS.size())); // total peers count
            if (i == 1) { // the outbound row has two extra columns for block relay and manual peer counts
                result += strprintf("   %5i", m_block_relay_peers_count);
                if (m_manual_peers_count) result += strprintf("   %5i", m_manual_peers_count);
            }
        }

        // Report local addresses, ports, and scores.
        result += "\n\nLocal addresses";
        const std::vector<UniValue>& local_addrs{networkinfo["localaddresses"].getValues()};
        if (local_addrs.empty()) {
            result += ": n/a\n";
        } else {
            size_t max_addr_size{0};
            for (const UniValue& addr : local_addrs) {
                max_addr_size = std::max(addr["address"].get_str().length() + 1, max_addr_size);
            }
            for (const UniValue& addr : local_addrs) {
                result += strprintf("\n%-*s    port %6i    score %6i", max_addr_size, addr["address"].get_str(), addr["port"].getInt<int>(), addr["score"].getInt<int>());
            }
        }

        return JSONRPCReplyObj(UniValue{result}, NullUniValue, /*id=*/1, JSONRPCVersion::V2);
    }